

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O2

bool __thiscall
ON_PlaneSurface::Evaluate
          (ON_PlaneSurface *this,double s,double t,int der_count,int v_stride,double *v,int side,
          int *hint)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  double *pdVar3;
  double dVar4;
  bool bVar5;
  long lVar6;
  ON_3dPoint P;
  double local_68;
  double local_60;
  double local_50;
  ON_3dPoint local_48;
  
  puVar1 = &this->field_0xb0;
  puVar2 = &this->field_0x90;
  bVar5 = ON_Interval::operator!=((ON_Interval *)puVar1,(ON_Interval *)puVar2);
  local_50 = 1.0;
  if (bVar5) {
    dVar4 = ON_Interval::NormalizedParameterAt((ON_Interval *)puVar2,s);
    local_60 = ON_Interval::ParameterAt((ON_Interval *)puVar1,dVar4);
    local_68 = ON_Interval::Length((ON_Interval *)puVar1);
    dVar4 = ON_Interval::Length((ON_Interval *)puVar2);
    local_68 = local_68 / dVar4;
  }
  else {
    local_68 = 1.0;
    local_60 = s;
  }
  puVar1 = &this->field_0xc0;
  puVar2 = &this->field_0xa0;
  bVar5 = ON_Interval::operator!=((ON_Interval *)puVar1,(ON_Interval *)puVar2);
  if (bVar5) {
    dVar4 = ON_Interval::NormalizedParameterAt((ON_Interval *)puVar2,t);
    t = ON_Interval::ParameterAt((ON_Interval *)puVar1,dVar4);
    local_50 = ON_Interval::Length((ON_Interval *)puVar1);
    dVar4 = ON_Interval::Length((ON_Interval *)puVar2);
    local_50 = local_50 / dVar4;
  }
  ON_Plane::PointAt(&local_48,&this->m_plane,local_60,t);
  *v = local_48.x;
  v[1] = local_48.y;
  v[2] = local_48.z;
  if (0 < der_count) {
    lVar6 = (long)v_stride;
    pdVar3 = v + lVar6;
    *pdVar3 = (this->m_plane).xaxis.x * local_68;
    pdVar3[1] = (this->m_plane).xaxis.y * local_68;
    pdVar3[2] = local_68 * (this->m_plane).xaxis.z;
    pdVar3[lVar6] = (this->m_plane).yaxis.x * local_50;
    pdVar3[lVar6 + 1] = (this->m_plane).yaxis.y * local_50;
    pdVar3[lVar6 + 2] = local_50 * (this->m_plane).yaxis.z;
    if (der_count != 1) {
      memset(pdVar3 + lVar6 * 2,0,
             (long)(int)(v_stride * (((uint)((der_count + 2) * (der_count + 1)) >> 1) - 4)) * 8 +
             0x18);
    }
  }
  return true;
}

Assistant:

bool 
ON_PlaneSurface::Evaluate( // returns false if unable to evaluate
       double s, double t, // evaluation parameters
       int der_count,  // number of derivatives (>=0)
       int v_stride,   // v[] array stride (>=Dimension())
       double* v,      // v[] array of length stride*(ndir+1)
       int side,       // optional - determines which side to evaluate from
                       //         0 = default
                       //      <  0 to evaluate from below, 
                       //      >  0 to evaluate from above
       int* hint       // optional - evaluation hint (int) used to speed
                       //            repeated evaluations
       ) const
{
  double ds = 1.0;
  double dt = 1.0;
  if ( m_extents[0] != m_domain[0] )
  {
    s = m_extents[0].ParameterAt( m_domain[0].NormalizedParameterAt(s) );
    ds = m_extents[0].Length()/m_domain[0].Length();
  }
  if ( m_extents[1] != m_domain[1] )
  {
    t = m_extents[1].ParameterAt( m_domain[1].NormalizedParameterAt(t) );
    dt = m_extents[1].Length()/m_domain[1].Length();
  }
  ON_3dPoint P = m_plane.PointAt( s, t );
  v[0] = P.x;
  v[1] = P.y;
  v[2] = P.z;
  v += v_stride;
  if ( der_count >= 1 ) 
  {
    v[0] = ds*m_plane.xaxis.x;
    v[1] = ds*m_plane.xaxis.y;
    v[2] = ds*m_plane.xaxis.z;
    v += v_stride;

    v[0] = dt*m_plane.yaxis.x;
    v[1] = dt*m_plane.yaxis.y;
    v[2] = dt*m_plane.yaxis.z;
    v += v_stride;

    if ( der_count > 1 ) 
    {
      // zero higher partials
      memset( v, 0, (((der_count+1)*(der_count+2)/2-4)*v_stride+3)*sizeof(*v) );
    }
  }
  return true;
}